

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

Value * DumpCTestProperties(Value *__return_storage_ptr__,cmCTestTestProperties *testProperties)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  Value *pVVar3;
  _Rb_tree_node_base *p_Var4;
  pointer pvVar5;
  pointer value;
  Value requirements;
  Value measurement;
  Value res;
  Value timeoutAfterMatch;
  ValueHolder local_540 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  Value *local_518;
  Value local_510;
  ValueHolder local_4e8 [2];
  long local_4d8 [3];
  ValueHolder local_4c0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  string local_498;
  pointer local_478;
  pointer local_470;
  Value local_468;
  Value local_440;
  Value local_418;
  Value local_3f0;
  Value local_3c8;
  Value local_3a0;
  Value local_378;
  Value local_350;
  Value local_328;
  Value local_300;
  Value local_2d8;
  Value local_2b0;
  Value local_288;
  Value local_260;
  Value local_238;
  Value local_210;
  Value local_1e8;
  Value local_1c0;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  local_518 = __return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  if ((testProperties->AttachOnFail).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->AttachOnFail).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"ATTACHED_FILES_ON_FAIL","")
    ;
    DumpToJsonArray(&local_58,&testProperties->AttachOnFail);
    DumpCTestProperty(&local_510,(string *)local_540,&local_58);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_58);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->AttachedFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->AttachedFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"ATTACHED_FILES","");
    DumpToJsonArray(&local_80,&testProperties->AttachedFiles);
    DumpCTestProperty(&local_510,(string *)local_540,&local_80);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_80);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->Cost != 0.0) || (NAN(testProperties->Cost))) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"COST","");
    Json::Value::Value(&local_a8,(double)testProperties->Cost);
    DumpCTestProperty(&local_510,(string *)local_540,&local_a8);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_a8);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->Depends).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->Depends).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"DEPENDS","");
    DumpToJsonArray(&local_d0,&testProperties->Depends);
    DumpCTestProperty(&local_510,(string *)local_540,&local_d0);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_d0);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if (testProperties->Disabled == true) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"DISABLED","");
    Json::Value::Value(&local_f8,testProperties->Disabled);
    DumpCTestProperty(&local_510,(string *)local_540,&local_f8);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_f8);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->Environment).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->Environment).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"ENVIRONMENT","");
    DumpToJsonArray(&local_120,&testProperties->Environment);
    DumpCTestProperty(&local_510,(string *)local_540,&local_120);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_120);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->EnvironmentModification).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->EnvironmentModification).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_540,"ENVIRONMENT_MODIFICATION","");
    DumpToJsonArray(&local_148,&testProperties->EnvironmentModification);
    DumpCTestProperty(&local_510,(string *)local_540,&local_148);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_148);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->ErrorRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->ErrorRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_540,"FAIL_REGULAR_EXPRESSION","");
    DumpRegExToJsonArray(&local_170,&testProperties->ErrorRegularExpressions);
    DumpCTestProperty(&local_510,(string *)local_540,&local_170);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_170);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->SkipRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->SkipRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_540,"SKIP_REGULAR_EXPRESSION","");
    DumpRegExToJsonArray(&local_198,&testProperties->SkipRegularExpressions);
    DumpCTestProperty(&local_510,(string *)local_540,&local_198);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_198);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"FIXTURES_CLEANUP","");
    DumpToJsonArray(&local_1c0,&testProperties->FixturesCleanup);
    DumpCTestProperty(&local_510,(string *)local_540,&local_1c0);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_1c0);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->FixturesRequired)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"FIXTURES_REQUIRED","");
    DumpToJsonArray(&local_1e8,&testProperties->FixturesRequired);
    DumpCTestProperty(&local_510,(string *)local_540,&local_1e8);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_1e8);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->FixturesSetup)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"FIXTURES_SETUP","");
    DumpToJsonArray(&local_210,&testProperties->FixturesSetup);
    DumpCTestProperty(&local_510,(string *)local_540,&local_210);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_210);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->Labels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->Labels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"LABELS","");
    DumpToJsonArray(&local_238,&testProperties->Labels);
    DumpCTestProperty(&local_510,(string *)local_540,&local_238);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_238);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->Measurements)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_4c0[0].string_ = (char *)&local_4b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4c0,"MEASUREMENT","");
    Json::Value::Value(&local_418,arrayValue);
    p_Var4 = (testProperties->Measurements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(testProperties->Measurements)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      do {
        Json::Value::Value(&local_510,objectValue);
        Json::Value::Value((Value *)local_540,(String *)(p_Var4 + 1));
        pVVar3 = Json::Value::operator[](&local_510,"measurement");
        Json::Value::operator=(pVVar3,(Value *)local_540);
        Json::Value::~Value((Value *)local_540);
        Json::Value::Value((Value *)local_540,(String *)(p_Var4 + 2));
        pVVar3 = Json::Value::operator[](&local_510,"value");
        Json::Value::operator=(pVVar3,(Value *)local_540);
        Json::Value::~Value((Value *)local_540);
        Json::Value::append(&local_418,&local_510);
        Json::Value::~Value(&local_510);
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
    DumpCTestProperty((Value *)local_4e8,(string *)local_4c0,&local_418);
    Json::Value::append(local_518,(Value *)local_4e8);
    Json::Value::~Value((Value *)local_4e8);
    Json::Value::~Value(&local_418);
    if (local_4c0[0] != &local_4b0) {
      operator_delete(local_4c0[0].string_,local_4b0._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->RequiredRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->RequiredRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_540,"PASS_REGULAR_EXPRESSION","");
    DumpRegExToJsonArray(&local_260,&testProperties->RequiredRegularExpressions);
    DumpCTestProperty(&local_510,(string *)local_540,&local_260);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_260);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->ResourceGroups).
      super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->ResourceGroups).
      super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"RESOURCE_GROUPS","");
    Json::Value::Value(&local_440,arrayValue);
    pvVar5 = (testProperties->ResourceGroups).
             super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_478 = (testProperties->ResourceGroups).
                super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar5 != local_478) {
      do {
        Json::Value::Value(&local_510,objectValue);
        Json::Value::Value((Value *)local_540,arrayValue);
        pcVar2 = (pvVar5->
                 super__Vector_base<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        local_470 = pvVar5;
        for (value = (pvVar5->
                     super__Vector_base<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                     )._M_impl.super__Vector_impl_data._M_start; value != pcVar2; value = value + 1)
        {
          Json::Value::Value((Value *)local_4e8,objectValue);
          Json::Value::Value((Value *)local_4c0,&value->ResourceType);
          pVVar3 = Json::Value::operator[]((Value *)local_4e8,".type");
          Json::Value::operator=(pVVar3,(Value *)local_4c0);
          Json::Value::~Value((Value *)local_4c0);
          Json::Value::Value((Value *)local_4c0,value->SlotsNeeded);
          pVVar3 = Json::Value::operator[]((Value *)local_4e8,"slots");
          Json::Value::operator=(pVVar3,(Value *)local_4c0);
          Json::Value::~Value((Value *)local_4c0);
          Json::Value::append((Value *)local_540,(Value *)local_4e8);
          Json::Value::~Value((Value *)local_4e8);
        }
        pVVar3 = Json::Value::operator[](&local_510,"requirements");
        Json::Value::operator=(pVVar3,(Value *)local_540);
        Json::Value::append(&local_440,&local_510);
        Json::Value::~Value((Value *)local_540);
        Json::Value::~Value(&local_510);
        pvVar5 = local_470 + 1;
      } while (pvVar5 != local_478);
    }
    DumpCTestProperty(&local_288,&local_498,&local_440);
    Json::Value::append(local_518,&local_288);
    Json::Value::~Value(&local_288);
    Json::Value::~Value(&local_440);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
  }
  if (testProperties->WantAffinity == true) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"PROCESSOR_AFFINITY","");
    Json::Value::Value(&local_2b0,testProperties->WantAffinity);
    DumpCTestProperty(&local_510,(string *)local_540,&local_2b0);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_2b0);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if (testProperties->Processors != 1) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"PROCESSORS","");
    Json::Value::Value(&local_2d8,testProperties->Processors);
    DumpCTestProperty(&local_510,(string *)local_540,&local_2d8);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_2d8);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->RequiredFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->RequiredFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"REQUIRED_FILES","");
    DumpToJsonArray(&local_300,&testProperties->RequiredFiles);
    DumpCTestProperty(&local_510,(string *)local_540,&local_300);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_300);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->LockedResources)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"RESOURCE_LOCK","");
    DumpToJsonArray(&local_328,&testProperties->LockedResources);
    DumpCTestProperty(&local_510,(string *)local_540,&local_328);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_328);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if (testProperties->RunSerial == true) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"RUN_SERIAL","");
    Json::Value::Value(&local_350,testProperties->RunSerial);
    DumpCTestProperty(&local_510,(string *)local_540,&local_350);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_350);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if (testProperties->SkipReturnCode != -1) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"SKIP_RETURN_CODE","");
    Json::Value::Value(&local_378,testProperties->SkipReturnCode);
    DumpCTestProperty(&local_510,(string *)local_540,&local_378);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_378);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if (testProperties->ExplicitTimeout == true) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"TIMEOUT","");
    Json::Value::Value(&local_3a0,(testProperties->Timeout).__r);
    DumpCTestProperty(&local_510,(string *)local_540,&local_3a0);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_3a0);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->TimeoutRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->TimeoutRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_4e8[0].string_ = (char *)local_4d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"TIMEOUT_AFTER_MATCH","");
    Json::Value::Value(&local_468,objectValue);
    Json::Value::Value(&local_510,(testProperties->AlternateTimeout).__r);
    pVVar3 = Json::Value::operator[](&local_468,"timeout");
    Json::Value::operator=(pVVar3,&local_510);
    Json::Value::~Value(&local_510);
    DumpRegExToJsonArray(&local_510,&testProperties->TimeoutRegularExpressions);
    pVVar3 = Json::Value::operator[](&local_468,"regex");
    Json::Value::operator=(pVVar3,&local_510);
    Json::Value::~Value(&local_510);
    DumpCTestProperty((Value *)local_540,(string *)local_4e8,&local_468);
    Json::Value::append(local_518,(Value *)local_540);
    Json::Value::~Value((Value *)local_540);
    Json::Value::~Value(&local_468);
    if (local_4e8[0] != local_4d8) {
      operator_delete(local_4e8[0].string_,local_4d8[0] + 1);
    }
  }
  if (testProperties->WillFail == true) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"WILL_FAIL","");
    Json::Value::Value(&local_3c8,testProperties->WillFail);
    DumpCTestProperty(&local_510,(string *)local_540,&local_3c8);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_3c8);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  if ((testProperties->Directory)._M_string_length != 0) {
    local_540[0].string_ = (char *)&local_530;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"WORKING_DIRECTORY","");
    Json::Value::Value(&local_3f0,&testProperties->Directory);
    DumpCTestProperty(&local_510,(string *)local_540,&local_3f0);
    Json::Value::append(local_518,&local_510);
    Json::Value::~Value(&local_510);
    Json::Value::~Value(&local_3f0);
    if (local_540[0] != &local_530) {
      operator_delete(local_540[0].string_,local_530._M_allocated_capacity + 1);
    }
  }
  return local_518;
}

Assistant:

static Json::Value DumpCTestProperties(
  cmCTestTestHandler::cmCTestTestProperties& testProperties)
{
  Json::Value properties = Json::arrayValue;
  if (!testProperties.AttachOnFail.empty()) {
    properties.append(DumpCTestProperty(
      "ATTACHED_FILES_ON_FAIL", DumpToJsonArray(testProperties.AttachOnFail)));
  }
  if (!testProperties.AttachedFiles.empty()) {
    properties.append(DumpCTestProperty(
      "ATTACHED_FILES", DumpToJsonArray(testProperties.AttachedFiles)));
  }
  if (testProperties.Cost != 0.0f) {
    properties.append(
      DumpCTestProperty("COST", static_cast<double>(testProperties.Cost)));
  }
  if (!testProperties.Depends.empty()) {
    properties.append(
      DumpCTestProperty("DEPENDS", DumpToJsonArray(testProperties.Depends)));
  }
  if (testProperties.Disabled) {
    properties.append(DumpCTestProperty("DISABLED", testProperties.Disabled));
  }
  if (!testProperties.Environment.empty()) {
    properties.append(DumpCTestProperty(
      "ENVIRONMENT", DumpToJsonArray(testProperties.Environment)));
  }
  if (!testProperties.EnvironmentModification.empty()) {
    properties.append(DumpCTestProperty(
      "ENVIRONMENT_MODIFICATION",
      DumpToJsonArray(testProperties.EnvironmentModification)));
  }
  if (!testProperties.ErrorRegularExpressions.empty()) {
    properties.append(DumpCTestProperty(
      "FAIL_REGULAR_EXPRESSION",
      DumpRegExToJsonArray(testProperties.ErrorRegularExpressions)));
  }
  if (!testProperties.SkipRegularExpressions.empty()) {
    properties.append(DumpCTestProperty(
      "SKIP_REGULAR_EXPRESSION",
      DumpRegExToJsonArray(testProperties.SkipRegularExpressions)));
  }
  if (!testProperties.FixturesCleanup.empty()) {
    properties.append(DumpCTestProperty(
      "FIXTURES_CLEANUP", DumpToJsonArray(testProperties.FixturesCleanup)));
  }
  if (!testProperties.FixturesRequired.empty()) {
    properties.append(DumpCTestProperty(
      "FIXTURES_REQUIRED", DumpToJsonArray(testProperties.FixturesRequired)));
  }
  if (!testProperties.FixturesSetup.empty()) {
    properties.append(DumpCTestProperty(
      "FIXTURES_SETUP", DumpToJsonArray(testProperties.FixturesSetup)));
  }
  if (!testProperties.Labels.empty()) {
    properties.append(
      DumpCTestProperty("LABELS", DumpToJsonArray(testProperties.Labels)));
  }
  if (!testProperties.Measurements.empty()) {
    properties.append(DumpCTestProperty(
      "MEASUREMENT", DumpMeasurementToJsonArray(testProperties.Measurements)));
  }
  if (!testProperties.RequiredRegularExpressions.empty()) {
    properties.append(DumpCTestProperty(
      "PASS_REGULAR_EXPRESSION",
      DumpRegExToJsonArray(testProperties.RequiredRegularExpressions)));
  }
  if (!testProperties.ResourceGroups.empty()) {
    properties.append(DumpCTestProperty(
      "RESOURCE_GROUPS",
      DumpResourceGroupsToJsonArray(testProperties.ResourceGroups)));
  }
  if (testProperties.WantAffinity) {
    properties.append(
      DumpCTestProperty("PROCESSOR_AFFINITY", testProperties.WantAffinity));
  }
  if (testProperties.Processors != 1) {
    properties.append(
      DumpCTestProperty("PROCESSORS", testProperties.Processors));
  }
  if (!testProperties.RequiredFiles.empty()) {
    properties.append(DumpCTestProperty(
      "REQUIRED_FILES", DumpToJsonArray(testProperties.RequiredFiles)));
  }
  if (!testProperties.LockedResources.empty()) {
    properties.append(DumpCTestProperty(
      "RESOURCE_LOCK", DumpToJsonArray(testProperties.LockedResources)));
  }
  if (testProperties.RunSerial) {
    properties.append(
      DumpCTestProperty("RUN_SERIAL", testProperties.RunSerial));
  }
  if (testProperties.SkipReturnCode != -1) {
    properties.append(
      DumpCTestProperty("SKIP_RETURN_CODE", testProperties.SkipReturnCode));
  }
  if (testProperties.ExplicitTimeout) {
    properties.append(
      DumpCTestProperty("TIMEOUT", testProperties.Timeout.count()));
  }
  if (!testProperties.TimeoutRegularExpressions.empty()) {
    properties.append(DumpCTestProperty(
      "TIMEOUT_AFTER_MATCH", DumpTimeoutAfterMatch(testProperties)));
  }
  if (testProperties.WillFail) {
    properties.append(DumpCTestProperty("WILL_FAIL", testProperties.WillFail));
  }
  if (!testProperties.Directory.empty()) {
    properties.append(
      DumpCTestProperty("WORKING_DIRECTORY", testProperties.Directory));
  }
  return properties;
}